

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::block_downloading_alert::~block_downloading_alert(block_downloading_alert *this)

{
  block_downloading_alert *this_local;
  
  ~block_downloading_alert(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

struct TORRENT_EXPORT block_downloading_alert final : peer_alert
	{
		// internal
		block_downloading_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep
			, peer_id const& peer_id, int block_num, piece_index_t piece_num);

		TORRENT_DEFINE_ALERT(block_downloading_alert, 31)

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#endif
		static constexpr alert_category_t static_category =
			alert_category::block_progress
			PROGRESS_NOTIFICATION
		;
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
		std::string message() const override;

		int const block_index;
		piece_index_t const piece_index;
#if TORRENT_ABI_VERSION == 1
		char const* TORRENT_DEPRECATED_MEMBER peer_speedmsg;
#endif
	}